

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

uint32 __thiscall Js::JavascriptStackWalker::GetByteCodeOffset(JavascriptStackWalker *this)

{
  bool bVar1;
  uint in_EAX;
  undefined8 uStack_18;
  uint32 offset;
  
  uStack_18 = (ulong)in_EAX;
  if (((*(ushort *)&this->field_0x50 & 4) == 0 & ((byte)*(ushort *)&this->field_0x50 ^ 1)) == 0) {
    if (this->interpreterFrame != (InterpreterStackFrame *)0x0) {
      bVar1 = TryGetByteCodeOffsetFromInterpreterFrame(this,(uint32 *)((long)&uStack_18 + 4));
      if (bVar1) goto LAB_009d2534;
    }
    TryGetByteCodeOffsetFromNativeFrame(this,(uint32 *)((long)&uStack_18 + 4));
  }
LAB_009d2534:
  return uStack_18._4_4_;
}

Assistant:

uint32 JavascriptStackWalker::GetByteCodeOffset() const
    {
        uint32 offset = 0;
        if (this->IsJavascriptFrame())
        {
            if (this->interpreterFrame)
            {
                if (this->TryGetByteCodeOffsetFromInterpreterFrame(offset))
                {
                    return offset;
                }
            }

#if ENABLE_NATIVE_CODEGEN
            if (TryGetByteCodeOffsetFromNativeFrame(offset))
            {
                return offset;
            }
#endif
        }
        return offset;
    }